

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O3

qreal __thiscall QSimplex::solver(QSimplex *this,SolverFactor factor)

{
  double dVar1;
  qreal *pqVar2;
  Span *pSVar3;
  double *pdVar4;
  ulong uVar5;
  bool bVar6;
  Data *pDVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  if (0 < (long)this->columns) {
    memset(this->matrix,0,(long)this->columns << 3);
  }
  pDVar7 = (this->objective->variables).d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar8 = 0;
LAB_00643da4:
    dVar10 = 0.0;
    if (uVar8 == 0 && pDVar7 == (Data *)0x0) goto LAB_00643e63;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar5 = 1;
      do {
        uVar8 = uVar5;
        if (pDVar7->numBuckets == uVar8) {
          pDVar7 = (Data *)0x0;
          uVar8 = 0;
          break;
        }
        uVar5 = uVar8 + 1;
      } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      goto LAB_00643da4;
    }
    uVar8 = 0;
  }
  pqVar2 = this->matrix;
  dVar10 = 0.0;
  do {
    pSVar3 = pDVar7->spans;
    pdVar4 = *(double **)
              pSVar3[uVar8 >> 7].entries[pSVar3[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.
              data;
    lVar9 = (long)*(int *)(pdVar4 + 1);
    dVar1 = *(double *)
             (pSVar3[uVar8 >> 7].entries[pSVar3[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.
              data + 8);
    if (lVar9 == -1) {
      dVar10 = dVar10 + dVar1 * *pdVar4;
    }
    else {
      pqVar2[lVar9] = dVar1 * (double)-factor;
    }
    do {
      if (pDVar7->numBuckets - 1 == uVar8) {
        uVar8 = 0;
        pDVar7 = (Data *)0x0;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (pSVar3[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
  } while ((uVar8 != 0) || (pDVar7 != (Data *)0x0));
LAB_00643e63:
  reducedRowEchelon(this);
  do {
    bVar6 = iterate(this);
  } while (bVar6);
  collectResults(this);
  return (double)factor * this->matrix[(long)this->columns + -1] + dVar10;
}

Assistant:

qreal QSimplex::solver(SolverFactor factor)
{
    // Remove old objective
    clearRow(0);

    // Set new objective in the first row of the simplex matrix
    qreal resultOffset = 0;
    for (auto iter = objective->variables.cbegin(); iter != objective->variables.cend(); ++iter) {

        // Check if the variable was removed in the simplification process.
        // If so, we save its offset to the objective function and skip adding
        // it to the matrix.
        if (iter.key()->index == -1) {
            resultOffset += iter.value() * iter.key()->result;
            continue;
        }

        setValueAt(0, iter.key()->index, -1 * factor * iter.value());
    }

    solveMaxHelper();
    collectResults();

#ifdef QT_DEBUG
    for (int i = 0; i < constraints.size(); ++i) {
        Q_ASSERT(constraints[i]->isSatisfied());
    }
#endif

    // Return the value calculated by the simplex plus the value of the
    // fixed variables.
    return (qToUnderlying(factor) * valueAt(0, columns - 1)) + resultOffset;
}